

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkHttpClient::openWebSocket
          (NetworkHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  HttpClient *pHVar1;
  int __flags;
  void *__child_stack;
  __fn *in_R8;
  void *__arg;
  Options in_R9W;
  HttpHeaderId id;
  StringPtr url_00;
  StringPtr local_1e8;
  ArrayPtr<const_char> local_1d8;
  undefined8 local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b8 [8];
  HttpHeaders headersCopy;
  undefined1 local_148 [8];
  String path;
  undefined1 local_118 [8];
  Url parsed;
  Options urlOptions;
  HttpHeaders *headers_local;
  NetworkHttpClient *this_local;
  StringPtr url_local;
  
  UrlOptions::UrlOptions((UrlOptions *)&parsed.field_0xde);
  parsed._222_2_ = 0x100;
  path.content.disposer._6_2_ = 0x100;
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)headers;
  __flags = 1;
  Url::parse((Url *)local_118,(Url *)url.content.size_,url_00,0x100,in_R9W);
  Url::toString((String *)local_148,(Url *)local_118,HTTP_REQUEST);
  HttpHeaders::clone((HttpHeaders *)local_1b8,in_R8,__child_stack,__flags,__arg);
  local_1c8 = 0;
  uStack_1c0 = 0xb;
  uStack_1bc = 0;
  StringPtr::StringPtr
            ((StringPtr *)&local_1d8,
             (String *)
             &parsed.userInfo.ptr.field_1.value.password.ptr.field_1.value.content.disposer);
  id.id = uStack_1c0;
  id.table = (HttpHeaderTable *)local_1c8;
  id._12_4_ = 0;
  HttpHeaders::set((HttpHeaders *)local_1b8,id,(StringPtr)local_1d8);
  pHVar1 = getClient((NetworkHttpClient *)url.content.ptr,(Url *)local_118);
  StringPtr::StringPtr(&local_1e8,(String *)local_148);
  (*pHVar1->_vptr_HttpClient[1])
            (this,pHVar1,local_1e8.content.ptr,local_1e8.content.size_,local_1b8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_1b8);
  String::~String((String *)local_148);
  Url::~Url((Url *)local_118);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We need to parse the proxy-style URL to convert it to origin-form.
    // https://www.rfc-editor.org/rfc/rfc9112.html#name-origin-form
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).openWebSocket(path, headersCopy);
  }